

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O0

int spi_open(int argc,char **argv)

{
  int iVar1;
  int ret;
  char **argv_local;
  int argc_local;
  
  parse_opts(argc,argv);
  i2s_fd = open(device,2);
  if (i2s_fd < 0) {
    pabort("can\'t open device");
    argv_local._4_4_ = 1;
  }
  else {
    printf("spi open\n");
    iVar1 = ioctl(i2s_fd,0x40046b05,&mode);
    if (iVar1 == -1) {
      pabort("can\'t set spi mode");
      argv_local._4_4_ = 1;
    }
    else {
      iVar1 = ioctl(i2s_fd,0x80046b05,&mode);
      if (iVar1 == -1) {
        pabort("can\'t get spi mode");
        argv_local._4_4_ = 1;
      }
      else {
        iVar1 = ioctl(i2s_fd,0x40016b03,&bits);
        if (iVar1 == -1) {
          pabort("can\'t set bits per word");
          argv_local._4_4_ = 1;
        }
        else {
          iVar1 = ioctl(i2s_fd,0x80016b03,&bits);
          if (iVar1 == -1) {
            pabort("can\'t get bits per word");
            argv_local._4_4_ = 1;
          }
          else {
            iVar1 = ioctl(i2s_fd,0x40046b04,&speed);
            if (iVar1 == -1) {
              pabort("can\'t set max speed hz");
              argv_local._4_4_ = 1;
            }
            else {
              iVar1 = ioctl(i2s_fd,0x80046b04,&speed);
              if (iVar1 == -1) {
                pabort("can\'t get max speed hz");
                argv_local._4_4_ = 1;
              }
              else {
                printf("spi mode: 0x%x\n",(ulong)mode);
                printf("bits per word: %d\n",(ulong)bits);
                printf("max speed: %d Hz (%d KHz)\n",(ulong)speed,(ulong)speed / 1000);
                spi_mode_enable();
                argv_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int spi_open(int argc, char *argv[])
{
	int ret = 0;

	parse_opts(argc, argv);

	i2s_fd = open(device, O_RDWR);
	if (i2s_fd < 0) {
		pabort("can't open device");
		return 1;
	}
	else
	{
		printf("spi open\n");
	}

	/*
	 * spi mode
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_MODE32, &mode);
	if (ret == -1) {
		pabort("can't set spi mode");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_MODE32, &mode);
	if (ret == -1) {
		pabort("can't get spi mode");
		return 1;
	}

	/*
	 * bits per word
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_BITS_PER_WORD, &bits);
	if (ret == -1) {
		pabort("can't set bits per word");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_BITS_PER_WORD, &bits);
	if (ret == -1) {
		pabort("can't get bits per word");
		return 1;
	}

	/*
	 * max speed hz
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_MAX_SPEED_HZ, &speed);
	if (ret == -1) {
		pabort("can't set max speed hz");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_MAX_SPEED_HZ, &speed);
	if (ret == -1) {
		pabort("can't get max speed hz");
		return 1;
	}

	printf("spi mode: 0x%x\n", mode);
	printf("bits per word: %d\n", bits);
	printf("max speed: %d Hz (%d KHz)\n", speed, speed/1000);
	spi_mode_enable();
	return 0;
}